

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequentialProps.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  SimInfo *pSVar3;
  SimInfo *info;
  int privilegedAxis;
  RealType dropletR;
  RealType solidZ;
  RealType centroidY;
  string sele1;
  string sele2;
  RealType bufferLength;
  RealType threshDens;
  string dumpFileName;
  SimInfo *local_260;
  SimCreator creator;
  gengetopt_args_info args_info;
  
  iVar1 = cmdline_parser(argc,argv,&args_info);
  if (iVar1 != 0) {
    exit(1);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dumpFileName,args_info.input_arg,(allocator<char> *)&creator);
  sele1._M_dataplus._M_p = (pointer)&sele1.field_2;
  sele1._M_string_length = 0;
  sele2._M_dataplus._M_p = (pointer)&sele2.field_2;
  sele2._M_string_length = 0;
  sele1.field_2._M_local_buf[0] = '\0';
  sele2.field_2._M_local_buf[0] = '\0';
  if (args_info.sele1_given == 0) {
    getenv("SELECTION1");
    std::__cxx11::string::assign((char *)&sele1);
  }
  else {
    std::__cxx11::string::assign((char *)&sele1);
  }
  if (args_info.sele2_given == 0) {
    pcVar2 = getenv("SELECTION2");
    if (pcVar2 == (char *)0x0) {
      std::__cxx11::string::_M_assign((string *)&sele2);
    }
    else {
      std::__cxx11::string::assign((char *)&sele2);
    }
  }
  else {
    std::__cxx11::string::assign((char *)&sele2);
  }
  creator.mdFileName_._M_dataplus._M_p = (pointer)&creator.mdFileName_.field_2;
  creator._vptr_SimCreator = (_func_int **)&PTR__SimCreator_002220e8;
  creator.mdFileName_._M_string_length = 0;
  creator.mdFileName_.field_2._M_local_buf[0] = '\0';
  info = OpenMD::SimCreator::createSim(&creator,&dumpFileName,false);
  if (args_info.privilegedAxis_arg == privilegedAxis_arg_x) {
    privilegedAxis = 0;
  }
  else if (args_info.privilegedAxis_arg == privilegedAxis_arg_y) {
    privilegedAxis = 1;
  }
  else {
    privilegedAxis = 2;
  }
  if (args_info.com_given == 0) {
    if (args_info.comvel_given != 0) {
      std::
      make_unique<OpenMD::COMVel,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                ((SimInfo **)&solidZ,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&info,
                 &dumpFileName,&sele1);
      pSVar3 = (SimInfo *)solidZ;
      goto LAB_00122371;
    }
    if (args_info.fluxOut_given != 0) {
      std::
      make_unique<OpenMD::FluxOut,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,int&>
                ((SimInfo **)&solidZ,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&info,
                 &dumpFileName,(int *)&sele1);
      pSVar3 = (SimInfo *)solidZ;
      goto LAB_00122371;
    }
    if (args_info.deltaCount_given != 0) {
      std::
      make_unique<OpenMD::CountDifference,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                ((SimInfo **)&solidZ,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&info,
                 &dumpFileName,&sele1);
      pSVar3 = (SimInfo *)solidZ;
      goto LAB_00122371;
    }
    if (args_info.testequi_given != 0) {
      std::
      make_unique<OpenMD::Equipartition,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                ((SimInfo **)&solidZ,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&info,
                 &dumpFileName,&sele1);
      pSVar3 = (SimInfo *)solidZ;
      goto LAB_00122371;
    }
    if (args_info.gcn_given == 0) {
      if (args_info.ca1_given == 0) {
        if (args_info.ca2_given == 0) goto LAB_00122470;
        solidZ = 0.0;
        if (args_info.referenceZ_given == 0) {
          builtin_strncpy(painCave.errMsg + 0x10,"t be set if --ca2 is used\n",0x1b);
          builtin_strncpy(painCave.errMsg,"--referenceZ mus",0x10);
          painCave.isFatal = 1;
          painCave.severity = 1;
          simError();
        }
        else {
          solidZ = args_info.referenceZ_arg;
        }
        dropletR = 0.0;
        if (args_info.centroidX_given == 0) {
          builtin_strncpy(painCave.errMsg + 0x10," be set if --ca2 is used\n",0x1a);
          builtin_strncpy(painCave.errMsg,"--centroidX must",0x10);
          painCave.isFatal = 1;
          painCave.severity = 1;
          simError();
        }
        else {
          dropletR = args_info.centroidX_arg;
        }
        centroidY = 0.0;
        if (args_info.centroidY_given == 0) {
          builtin_strncpy(painCave.errMsg + 0x10," be set if --ca2 is used\n",0x1a);
          builtin_strncpy(painCave.errMsg,"--centroidY must",0x10);
          painCave.isFatal = 1;
          painCave.severity = 1;
          simError();
        }
        else {
          centroidY = args_info.centroidY_arg;
        }
        threshDens = 0.0;
        if (args_info.threshDens_given == 0) {
          builtin_strncpy(painCave.errMsg + 0x10,"t be set if --ca2 is used\n",0x1b);
          builtin_strncpy(painCave.errMsg,"--threshDens mus",0x10);
          painCave.isFatal = 1;
          painCave.severity = 1;
          simError();
        }
        else {
          threshDens = args_info.threshDens_arg;
        }
        bufferLength = 0.0;
        if (args_info.bufferLength_given == 0) {
          builtin_strncpy(painCave.errMsg + 0x10,"ust be set if --ca2 is used\n",0x1d);
          builtin_strncpy(painCave.errMsg,"--bufferLength m",0x10);
          painCave.isFatal = 1;
          painCave.severity = 1;
          simError();
        }
        else {
          bufferLength = args_info.bufferLength_arg;
        }
        std::
        make_unique<OpenMD::ContactAngle2,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,double&,double&,double&,double&,double&,int&,int&>
                  (&local_260,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&info,
                   &dumpFileName,&sele1,(double *)&sele2,&solidZ,&dropletR,&centroidY,&threshDens,
                   (int *)&bufferLength,&args_info.nbins_arg);
        pSVar3 = local_260;
      }
      else {
        solidZ = 0.0;
        if (args_info.referenceZ_given == 0) {
          builtin_strncpy(painCave.errMsg + 0x10,"t be set if --ca1 is used\n",0x1b);
          builtin_strncpy(painCave.errMsg,"--referenceZ mus",0x10);
          painCave.isFatal = 1;
          painCave.severity = 1;
          simError();
        }
        else {
          solidZ = args_info.referenceZ_arg;
        }
        dropletR = 0.0;
        if (args_info.dropletR_given == 0) {
          builtin_strncpy(painCave.errMsg + 0x10,"be set if --ca1 is used\n",0x19);
          builtin_strncpy(painCave.errMsg,"--dropletR must ",0x10);
          painCave.isFatal = 1;
          painCave.severity = 1;
          simError();
        }
        else {
          dropletR = args_info.dropletR_arg;
        }
        std::
        make_unique<OpenMD::ContactAngle1,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,double&,double&>
                  ((SimInfo **)&centroidY,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&info,
                   &dumpFileName,&sele1,(double *)&sele2,&solidZ);
        pSVar3 = (SimInfo *)centroidY;
      }
      goto LAB_00122371;
    }
    if (args_info.rcut_given != 0) {
      std::
      make_unique<OpenMD::GCNSeq,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,double&,int&>
                ((SimInfo **)&solidZ,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&info,
                 &dumpFileName,&sele1,(double *)&sele2,(int *)&args_info.rcut_arg);
      pSVar3 = (SimInfo *)solidZ;
      goto LAB_00122371;
    }
    memcpy(&painCave,
           "A cutoff radius (rcut) must be specified when calculating\n\tGeneralized Coordinate Number"
           ,0x59);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  else {
    std::
    make_unique<OpenMD::CenterOfMass,OpenMD::SimInfo*&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
              ((SimInfo **)&solidZ,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&info,
               &dumpFileName,&sele1);
    pSVar3 = (SimInfo *)solidZ;
LAB_00122371:
    if (pSVar3 != (SimInfo *)0x0) {
      if (args_info.output_given != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&solidZ,args_info.output_arg,(allocator<char> *)&dropletR);
        std::__cxx11::string::_M_assign
                  ((string *)
                   &pSVar3[2].properties_.propMap_._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_left);
        std::__cxx11::string::~string((string *)&solidZ);
      }
      (*pSVar3->_vptr_SimInfo[2])(pSVar3);
      goto LAB_001224b1;
    }
  }
LAB_00122470:
  builtin_strncpy(painCave.errMsg + 0x31," to do!",8);
  builtin_strncpy(painCave.errMsg + 0x10," No Analyzer was created, nothing",0x21);
  builtin_strncpy(painCave.errMsg,"SequentialProps:",0x10);
  painCave.isFatal = 1;
  painCave.severity = 1;
  simError();
  pSVar3 = (SimInfo *)0x0;
LAB_001224b1:
  if (info != (SimInfo *)0x0) {
    (*info->_vptr_SimInfo[1])();
  }
  if (pSVar3 != (SimInfo *)0x0) {
    (*pSVar3->_vptr_SimInfo[1])(pSVar3);
  }
  OpenMD::SimCreator::~SimCreator(&creator);
  std::__cxx11::string::~string((string *)&sele2);
  std::__cxx11::string::~string((string *)&sele1);
  std::__cxx11::string::~string((string *)&dumpFileName);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  gengetopt_args_info args_info;

  // parse the command line option
  if (cmdline_parser(argc, argv, &args_info) != 0) { exit(1); }

  // get the dumpfile name and meta-data file name
  std::string dumpFileName = args_info.input_arg;

  std::string sele1;
  std::string sele2;

  // check the first selection argument, or set it to the environment
  // variable, or failing that, set it to "select all"

  if (args_info.sele1_given) {
    sele1 = args_info.sele1_arg;
  } else {
    char* sele1Env = getenv("SELECTION1");
    if (sele1Env) {
      sele1 = sele1Env;
    } else {
      sele1 = "select all";
    }
  }

  // check the second selection argument, or set it to the environment
  // variable, or failing that, set it to the first selection

  if (args_info.sele2_given) {
    sele2 = args_info.sele2_arg;
  } else {
    char* sele2Env = getenv("SELECTION2");
    if (sele2Env) {
      sele2 = sele2Env;
    } else {
      // If sele2 is not specified, then the default behavior
      // should be what is already intended for sele1
      sele2 = sele1;
    }
  }

  // parse md file and set up the system
  SimCreator creator;
  SimInfo* info = creator.createSim(dumpFileName, false);

  // convert privilegedAxis to corresponding integer
  // x axis -> 0
  // y axis -> 1
  // z axis -> 2 (default)

  int privilegedAxis;
  switch (args_info.privilegedAxis_arg) {
  case privilegedAxis_arg_x:
    privilegedAxis = 0;
    break;
  case privilegedAxis_arg_y:
    privilegedAxis = 1;
    break;
  case privilegedAxis_arg_z:
  default:
    privilegedAxis = 2;
    break;
  }

  std::unique_ptr<SequentialAnalyzer> analyzer {nullptr};

  if (args_info.com_given) {
    analyzer = std::make_unique<CenterOfMass>(info, dumpFileName, sele1, sele2);
  } else if (args_info.comvel_given) {
    analyzer = std::make_unique<COMVel>(info, dumpFileName, sele1, sele2);
  } else if (args_info.fluxOut_given) {
    analyzer = std::make_unique<FluxOut>(info, dumpFileName, sele1,
					 privilegedAxis);
  } else if (args_info.deltaCount_given) {
    analyzer = std::make_unique<CountDifference>(info, dumpFileName, sele1,
						 sele2);
  } else if (args_info.testequi_given) {
    analyzer = std::make_unique<Equipartition>(info, dumpFileName, sele1,
					       sele2);
  } else if (args_info.gcn_given) {
    if (args_info.rcut_given) {
      analyzer = std::make_unique<GCNSeq>(info, dumpFileName, sele1, sele2,
					  args_info.rcut_arg,
					  args_info.nbins_arg);
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "A cutoff radius (rcut) must be specified when calculating\n"
               "\tGeneralized Coordinate Number");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }
  } else if (args_info.ca1_given) {
    RealType solidZ(0.0);
    if (args_info.referenceZ_given)
      solidZ = args_info.referenceZ_arg;
    else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "--referenceZ must be set if --ca1 is used\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }
    RealType dropletR(0.0);
    if (args_info.dropletR_given)
      dropletR = args_info.dropletR_arg;
    else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "--dropletR must be set if --ca1 is used\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    analyzer =
      std::make_unique<ContactAngle1>(info, dumpFileName, sele1, sele2,
				      solidZ, dropletR);
  } else if (args_info.ca2_given) {
    RealType solidZ(0.0);
    if (args_info.referenceZ_given)
      solidZ = args_info.referenceZ_arg;
    else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "--referenceZ must be set if --ca2 is used\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }
    RealType centroidX(0.0);
    if (args_info.centroidX_given)
      centroidX = args_info.centroidX_arg;
    else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "--centroidX must be set if --ca2 is used\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }
    RealType centroidY(0.0);
    if (args_info.centroidY_given)
      centroidY = args_info.centroidY_arg;
    else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "--centroidY must be set if --ca2 is used\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }
    RealType threshDens(0.0);
    if (args_info.threshDens_given)
      threshDens = args_info.threshDens_arg;
    else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "--threshDens must be set if --ca2 is used\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }
    RealType bufferLength(0.0);
    if (args_info.bufferLength_given)
      bufferLength = args_info.bufferLength_arg;
    else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "--bufferLength must be set if --ca2 is used\n");
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    analyzer = std::make_unique<ContactAngle2>(info, dumpFileName, sele1,
					       sele2, solidZ, centroidX,
					       centroidY, threshDens,
					       bufferLength,
					       args_info.nbins_arg,
					       args_info.nbins_z_arg);
  }

  if (analyzer != NULL) {
    
    if (args_info.output_given) {
      analyzer->setOutputName(args_info.output_arg);
    }

    analyzer->doSequence();
  } else {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "SequentialProps: No Analyzer was created, nothing to do!");
    painCave.severity = OPENMD_ERROR;
    painCave.isFatal  = 1;
    simError();
  }

  delete info;

  return 0;
}